

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O2

void __thiscall
logging_tests::logging_LogPrintMacros_CategoryName::test_method
          (logging_LogPrintMacros_CategoryName *this)

{
  long lVar1;
  pointer ppVar2;
  bool bVar3;
  Logger *pLVar4;
  istream *piVar5;
  pointer ppVar6;
  iterator in_R8;
  char *pcVar7;
  char *in_R9;
  pointer pbVar8;
  long in_FS_OFFSET;
  string_view pattern;
  const_string msg;
  const_string msg_00;
  const_string file_00;
  string_view str;
  const_string file_01;
  string_view str_00;
  string_view str_01;
  string_view source_file;
  string_view logging_function;
  check_type cVar9;
  char *local_368;
  char *local_360;
  equal_coll_impl local_351;
  LogFlags category;
  shared_count local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  log_lines;
  char *local_2f8;
  char *local_2f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  category_names;
  vector<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  expected_category_names;
  ifstream file;
  size_t local_278;
  string log;
  string concatenated_category_names;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar4 = LogInstance();
  BCLog::Logger::EnableCategory(pLVar4,ALL);
  pLVar4 = LogInstance();
  BCLog::Logger::LogCategoriesString_abi_cxx11_(&concatenated_category_names,pLVar4);
  expected_category_names.
  super__Vector_base<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expected_category_names.
  super__Vector_base<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expected_category_names.
  super__Vector_base<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  str_00._M_str = (char *)0x2c;
  str_00._M_len = (size_t)concatenated_category_names._M_dataplus._M_p;
  util::SplitString_abi_cxx11_
            (&category_names,(util *)concatenated_category_names._M_string_length,str_00,(char)in_R8
            );
  for (pbVar8 = category_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = expected_category_names.
               super__Vector_base<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      pbVar8 != category_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
    pattern._M_str = in_R9;
    pattern._M_len = (size_t)" \f\n\r\t\v";
    pcVar7 = " \f\n\r\t\v";
    str_01._M_str = (char *)0x6;
    str_01._M_len = (size_t)(pbVar8->_M_dataplus)._M_p;
    util::TrimString_abi_cxx11_((string *)&file,(util *)pbVar8->_M_string_length,str_01,pattern);
    local_2c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
    ;
    local_2b8 = "";
    local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = pcVar7;
    file_00.m_end = (iterator)0xa4;
    file_00.m_begin = (iterator)&local_2c0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2d0,msg
              );
    _cVar9 = 0x371f88;
    str._M_str = _file;
    str._M_len = local_278;
    bVar3 = GetLogCategory(&category,str);
    expected.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(expected.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar3);
    expected.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expected.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    log_lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_82876f;
    log_lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb9d094;
    log._M_string_length = log._M_string_length & 0xffffffffffffff00;
    log._M_dataplus._M_p = "<W\x1b";
    log.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    log.field_2._8_8_ = &log_lines;
    local_2f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
    ;
    local_2f0 = "";
    in_R8 = (iterator)0x2;
    in_R9 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected,(lazy_ostream *)&log,2,0,WARN,_cVar9,(size_t)&local_2f8
               ,0xa4);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &expected.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::pair<BCLog::LogFlags,std::__cxx11::string>,std::allocator<std::pair<BCLog::LogFlags,std::__cxx11::string>>>
    ::emplace_back<BCLog::LogFlags&,std::__cxx11::string_const&>
              ((vector<std::pair<BCLog::LogFlags,std::__cxx11::string>,std::allocator<std::pair<BCLog::LogFlags,std::__cxx11::string>>>
                *)&expected_category_names,&category,(string *)&file);
    std::__cxx11::string::~string((string *)&file);
  }
  expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (ppVar6 = expected_category_names.
                super__Vector_base<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar2; ppVar6 = ppVar6 + 1) {
    bVar3 = ::LogAcceptCategory(ppVar6->first,Debug);
    if (bVar3) {
      in_R9 = (char *)ppVar6->first;
      in_R8 = (iterator)0xaa;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
      ;
      source_file._M_len = 0x66;
      logging_function._M_str = "test_method";
      logging_function._M_len = 0xb;
      LogPrintFormatInternal<char[4]>
                (logging_function,source_file,0xaa,(LogFlags)in_R9,Debug,
                 (ConstevalFormatString<1U>)0xb9d095,(char (*) [4])0xc6930d);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&file,"[",(allocator<char> *)&log);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
               &ppVar6->second);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
               "] foo: bar");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&expected,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file
               );
    std::__cxx11::string::~string((string *)&file);
  }
  std::ifstream::ifstream<fs::path,fs::path>
            ((ifstream *)&file,&(this->super_LogSetup).tmp_log_path,_S_in);
  log_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  log._M_dataplus._M_p = (pointer)&log.field_2;
  log._M_string_length = 0;
  log_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  log_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  log.field_2._M_allocated_capacity = log.field_2._M_allocated_capacity & 0xffffffffffffff00;
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&file,(string *)&log);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&log_lines,&log);
  }
  std::__cxx11::string::~string((string *)&log);
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_01.m_end = (iterator)0xb6;
  file_01.m_begin = (iterator)&local_328;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_338,
             msg_00);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)&category,&local_351,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )log_lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )log_lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )expected.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )expected.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  log._M_string_length = log._M_string_length & 0xffffffffffffff00;
  log._M_dataplus._M_p = "<W\x1b";
  log.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  log.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
  ;
  local_360 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&category,(lazy_ostream *)&log,1,0xd,4,0xb9cf16,(size_t)&local_368,
             0xb6,"log_lines.end()","expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count(&local_340);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&log_lines);
  std::ifstream::~ifstream(&file);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expected);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&category_names);
  std::
  vector<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&expected_category_names);
  std::__cxx11::string::~string((string *)&concatenated_category_names);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(logging_LogPrintMacros_CategoryName, LogSetup)
{
    LogInstance().EnableCategory(BCLog::LogFlags::ALL);
    const auto concatenated_category_names = LogInstance().LogCategoriesString();
    std::vector<std::pair<BCLog::LogFlags, std::string>> expected_category_names;
    const auto category_names = SplitString(concatenated_category_names, ',');
    for (const auto& category_name : category_names) {
        BCLog::LogFlags category;
        const auto trimmed_category_name = TrimString(category_name);
        BOOST_REQUIRE(GetLogCategory(category, trimmed_category_name));
        expected_category_names.emplace_back(category, trimmed_category_name);
    }

    std::vector<std::string> expected;
    for (const auto& [category, name] : expected_category_names) {
        LogDebug(category, "foo: %s\n", "bar");
        std::string expected_log = "[";
        expected_log += name;
        expected_log += "] foo: bar";
        expected.push_back(expected_log);
    }

    std::ifstream file{tmp_log_path};
    std::vector<std::string> log_lines;
    for (std::string log; std::getline(file, log);) {
        log_lines.push_back(log);
    }
    BOOST_CHECK_EQUAL_COLLECTIONS(log_lines.begin(), log_lines.end(), expected.begin(), expected.end());
}